

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

spv_result_t
spvValidateBinary(spv_const_context context,uint32_t *words,size_t num_words,
                 spv_diagnostic *pDiagnostic)

{
  _Manager_type p_Var1;
  spv_result_t sVar2;
  spv_validator_options opt;
  spv_context_t hijack_context;
  ValidationState_t vstate;
  spv_context_t local_768;
  ValidationState_t local_720;
  
  local_768.target_env = context->target_env;
  local_768._4_4_ = *(undefined4 *)&context->field_0x4;
  local_768.opcode_table = context->opcode_table;
  local_768.operand_table._0_4_ = *(undefined4 *)&context->operand_table;
  local_768.operand_table._4_4_ = *(undefined4 *)((long)&context->operand_table + 4);
  local_768.ext_inst_table._0_4_ = *(undefined4 *)&context->ext_inst_table;
  local_768.ext_inst_table._4_4_ = *(undefined4 *)((long)&context->ext_inst_table + 4);
  local_768.consumer.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_768.consumer.super__Function_base._M_functor._8_8_ = 0;
  local_768.consumer.super__Function_base._M_manager = (_Manager_type)0x0;
  local_768.consumer._M_invoker = (_Invoker_type)0x0;
  p_Var1 = (context->consumer).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&local_768.consumer,(_Any_data *)&context->consumer,__clone_functor);
    local_768.consumer._M_invoker = (context->consumer)._M_invoker;
    local_768.consumer.super__Function_base._M_manager =
         (context->consumer).super__Function_base._M_manager;
  }
  if (pDiagnostic != (spv_diagnostic *)0x0) {
    *pDiagnostic = (spv_diagnostic)0x0;
    spvtools::UseDiagnosticAsMessageConsumer(&local_768,pDiagnostic);
  }
  opt = spvValidatorOptionsCreate();
  spvtools::val::ValidationState_t::ValidationState_t(&local_720,&local_768,opt,words,num_words,1);
  sVar2 = spvtools::val::anon_unknown_2::ValidateBinaryUsingContextAndValidationState
                    (&local_768,words,num_words,pDiagnostic,&local_720);
  spvValidatorOptionsDestroy(opt);
  spvtools::val::ValidationState_t::~ValidationState_t(&local_720);
  if (local_768.consumer.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_768.consumer.super__Function_base._M_manager)
              ((_Any_data *)&local_768.consumer,(_Any_data *)&local_768.consumer,__destroy_functor);
  }
  return sVar2;
}

Assistant:

spv_result_t spvValidateBinary(const spv_const_context context,
                               const uint32_t* words, const size_t num_words,
                               spv_diagnostic* pDiagnostic) {
  spv_context_t hijack_context = *context;
  if (pDiagnostic) {
    *pDiagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, pDiagnostic);
  }

  // This interface is used for default command line options.
  spv_validator_options default_options = spvValidatorOptionsCreate();

  // Create the ValidationState using the context and default options.
  spvtools::val::ValidationState_t vstate(&hijack_context, default_options,
                                          words, num_words,
                                          kDefaultMaxNumOfWarnings);

  spv_result_t result =
      spvtools::val::ValidateBinaryUsingContextAndValidationState(
          hijack_context, words, num_words, pDiagnostic, &vstate);

  spvValidatorOptionsDestroy(default_options);
  return result;
}